

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O0

void __thiscall
BeliefSetNonStationary::BeliefSetNonStationary(BeliefSetNonStationary *this,size_t nrTimeSteps)

{
  undefined8 uVar1;
  E *in_RSI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffd8;
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  __a = (allocator_type *)&stack0xffffffffffffffef;
  std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>::
  allocator((allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
             *)0x901254);
  std::
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  ::vector(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>::
  ~allocator((allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
              *)0x901274);
  if (in_RSI == (E *)0xf423f) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

BeliefSetNonStationary::BeliefSetNonStationary(size_t nrTimeSteps) :
    _m_beliefSets(nrTimeSteps+1)
{
    if(nrTimeSteps==MAXHORIZON)
        throw(E("BeliefSetNonStationary does not make sense in infinite-horizon setting"));
}